

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O0

int32_t __thiscall cornelich::vanilla_index::find_last_cycle(vanilla_index *this)

{
  bool bVar1;
  type_conflict tVar2;
  int32_t iVar3;
  string *psVar4;
  cycle_formatter *this_00;
  path local_d8;
  int32_t local_b4;
  reference pdStack_b0;
  int32_t cycle;
  directory_entry *entry;
  directory_iterator __end1;
  directory_iterator __begin1;
  directory_iterator local_90;
  iterator_range<boost::filesystem::directory_iterator> local_88;
  iterator_range<boost::filesystem::directory_iterator> *local_78;
  iterator_range<boost::filesystem::directory_iterator> *__range1;
  directory_iterator local_60;
  directory_iterator end;
  directory_iterator local_38;
  directory_iterator begin;
  error_code err;
  int last_cycle;
  vanilla_index *this_local;
  
  err.cat_._4_4_ = -1;
  boost::system::error_code::error_code((error_code *)&begin);
  psVar4 = vanilla_chronicle_settings::path_abi_cxx11_(this->m_settings);
  boost::filesystem::path::path((path *)&end,psVar4);
  boost::filesystem::directory_iterator::directory_iterator
            (&local_38,(path *)&end,(error_code *)&begin);
  boost::filesystem::path::~path((path *)&end);
  boost::filesystem::directory_iterator::directory_iterator(&local_60);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&begin);
  if ((!bVar1) &&
     (tVar2 = boost::iterators::operator==
                        ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                          *)&local_38,
                         (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                          *)&local_60), !tVar2)) {
    boost::filesystem::directory_iterator::directory_iterator(&local_90,&local_38);
    boost::filesystem::directory_iterator::directory_iterator(&__begin1,&local_60);
    boost::make_iterator_range<boost::filesystem::directory_iterator>
              ((boost *)&local_88,&local_90,&__begin1);
    boost::filesystem::directory_iterator::~directory_iterator(&__begin1);
    boost::filesystem::directory_iterator::~directory_iterator(&local_90);
    local_78 = &local_88;
    boost::iterator_range_detail::
    iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
    ::begin((iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
             *)&__end1);
    boost::iterator_range_detail::
    iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
    ::end((iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
           *)&entry);
    while (tVar2 = boost::iterators::operator!=
                             ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                               *)&__end1,
                              (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                               *)&entry), tVar2) {
      pdStack_b0 = boost::iterators::detail::
                   iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                   ::operator*((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                                *)&__end1);
      bVar1 = boost::filesystem::is_directory(pdStack_b0);
      if (bVar1) {
        this_00 = vanilla_chronicle_settings::cycle_format(this->m_settings);
        boost::filesystem::directory_entry::path(pdStack_b0);
        boost::filesystem::path::filename();
        psVar4 = boost::filesystem::path::string_abi_cxx11_(&local_d8);
        iVar3 = cycle_formatter::cycle_from_date(this_00,psVar4);
        boost::filesystem::path::~path(&local_d8);
        local_b4 = iVar3;
        if (err.cat_._4_4_ < iVar3) {
          err.cat_._4_4_ = iVar3;
        }
      }
      boost::iterators::detail::
      iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
      ::operator++((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                    *)&__end1);
    }
    __range1._0_4_ = 2;
    boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)&entry);
    boost::filesystem::directory_iterator::~directory_iterator(&__end1);
    boost::iterator_range<boost::filesystem::directory_iterator>::~iterator_range(&local_88);
  }
  __range1._0_4_ = 1;
  boost::filesystem::directory_iterator::~directory_iterator(&local_60);
  boost::filesystem::directory_iterator::~directory_iterator(&local_38);
  return err.cat_._4_4_;
}

Assistant:

std::int32_t vanilla_index::find_last_cycle() const
{
    auto last_cycle = -1;
    boost::system::error_code err;
    fs::directory_iterator begin(m_settings.path(), err);
    fs::directory_iterator end;

    // No directories -> empty
    if(err || begin == end)
        return last_cycle;

    // Find the newest directory
    for(const auto & entry : boost::make_iterator_range(begin, end))
    {
        if(!fs::is_directory(entry))
            continue;
        const auto cycle = m_settings.cycle_format().cycle_from_date(entry.path().filename().string());
        if (last_cycle < cycle)
            last_cycle = cycle;
    }
    return last_cycle;
}